

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveImports.cpp
# Opt level: O3

void __thiscall wasm::RemoveImports::~RemoveImports(RemoveImports *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>
           ).super_PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>.
           super_Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>::Task,_std::allocator<wasm::Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>
                                          .
                                          super_Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>::Task,_std::allocator<wasm::Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x130);
  return;
}

Assistant:

void visitCall(Call* curr) {
    auto* func = getModule()->getFunction(curr->target);
    if (!func->imported()) {
      return;
    }
    Type type = func->getResults();
    if (type == Type::none) {
      replaceCurrent(getModule()->allocator.alloc<Nop>());
    } else {
      Literal nopLiteral(type);
      replaceCurrent(getModule()->allocator.alloc<Const>()->set(nopLiteral));
    }
  }